

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_CutDsdPermLitMax(char *pPermLits,int nVars,int iVar)

{
  ulong uVar1;
  
  if ((iVar < 0) || (nVars <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x8ac,"int If_CutDsdPermLitMax(char *, int, int)");
  }
  if (0 < nVars) {
    uVar1 = 0;
    do {
      if (pPermLits[uVar1] < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if ((uint)((byte)pPermLits[uVar1] >> 1) == iVar) {
        return (int)uVar1;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)nVars != uVar1);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                ,0x8b0,"int If_CutDsdPermLitMax(char *, int, int)");
}

Assistant:

int If_CutDsdPermLitMax( char * pPermLits, int nVars, int iVar )
{
    int i;
    assert( iVar >= 0 && iVar < nVars );
    for ( i = 0; i < nVars; i++ )
        if ( iVar == Abc_Lit2Var((int)pPermLits[i]) )
            return i;
    assert( 0 );
    return -1;
}